

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O2

int Ivy_CutCheckDominance(Ivy_Cut_t *pDom,Ivy_Cut_t *pCut)

{
  short sVar1;
  ushort uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = pDom->nSize;
  uVar3 = 0;
  if ((short)uVar2 < 1) {
    uVar2 = 0;
  }
  do {
    if (uVar3 == uVar2) {
      return 1;
    }
    if ((uVar3 != 0) && (pDom->pArray[uVar3] <= pDom->pArray[uVar3 - 1])) {
      __assert_fail("i==0 || pDom->pArray[i-1] < pDom->pArray[i]",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivySeq.c"
                    ,0x353,"int Ivy_CutCheckDominance(Ivy_Cut_t *, Ivy_Cut_t *)");
    }
    sVar1 = pCut->nSize;
    uVar4 = 0;
    if (0 < sVar1) {
      uVar4 = (ulong)(uint)(int)sVar1;
    }
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      if (pDom->pArray[uVar3] == pCut->pArray[uVar5]) {
        uVar4 = uVar5 & 0xffffffff;
        break;
      }
    }
    uVar3 = uVar3 + 1;
    if ((uint)uVar4 == (int)sVar1) {
      return 0;
    }
  } while( true );
}

Assistant:

static inline int Ivy_CutCheckDominance( Ivy_Cut_t * pDom, Ivy_Cut_t * pCut )
{
    int i, k;
    for ( i = 0; i < pDom->nSize; i++ )
    {
        for ( k = 0; k < pCut->nSize; k++ )
            if ( pDom->pArray[i] == pCut->pArray[k] )
                break;
        if ( k == pCut->nSize ) // node i in pDom is not contained in pCut
            return 0;
    }
    // every node in pDom is contained in pCut
    return 1;
}